

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerselect.c
# Opt level: O0

int get_valid_genders(nh_roles_info *ri,int rolenum,int racenum,int alignnum,nh_listitem *list,
                     int listlen)

{
  int iVar1;
  int local_34;
  int local_30;
  int count;
  int i;
  int listlen_local;
  nh_listitem *list_local;
  int alignnum_local;
  int racenum_local;
  int rolenum_local;
  nh_roles_info *ri_local;
  
  local_34 = 0;
  for (local_30 = 0; local_30 < ri->num_genders; local_30 = local_30 + 1) {
    iVar1 = is_valid_character(ri,rolenum,racenum,local_30,alignnum);
    if (iVar1 != 0) {
      if ((list != (nh_listitem *)0x0) && (local_34 < listlen)) {
        strcpy(list[local_34].caption,ri->gendnames[local_30]);
        list[local_34].id = local_30;
      }
      local_34 = local_34 + 1;
    }
  }
  return local_34;
}

Assistant:

static int get_valid_genders(const struct nh_roles_info *ri, int rolenum,
			   int racenum, int alignnum, struct nh_listitem *list, int listlen)
{
    int i;
    int count = 0;
    
    for (i = 0; i < ri->num_genders; i++) {
	if (!is_valid_character(ri, rolenum, racenum, i, alignnum))
	    continue;
	
	if (list && count < listlen) {
	    strcpy(list[count].caption, ri->gendnames[i]);
	    list[count].id = i;
	}
	count++;
    }
    return count;
}